

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QByteArray>>>::
     call<QtPromise::QPromiseResolve<QList<QByteArray>>,QtPromise::QPromiseReject<QList<QByteArray>>>
               (QPromise<QList<QByteArray>_> *promise,QPromiseResolve<QList<QByteArray>_> *resolve,
               QPromiseReject<QList<QByteArray>_> *reject)

{
  QSharedData *pQVar1;
  PromiseData<QList<QByteArray>_> *this;
  PromiseData<QList<QByteArray>_> *this_00;
  anon_class_24_3_5928a092 callback;
  bool bVar2;
  QPromiseBase<void> local_80;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data> local_70
  ;
  undefined **local_68;
  PromiseData<QList<QByteArray>_> *local_60;
  anon_class_24_2_d74e9aa7 local_58;
  QPromise<QList<QByteArray>_> *local_40;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
  *pQStack_38;
  anon_class_24_2_d74e9aa7 *local_30;
  
  this = (promise->super_QPromiseBase<QList<QByteArray>_>).m_d.d;
  bVar2 = PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::isPending
                    (&this->
                      super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>);
  this_00 = (promise->super_QPromiseBase<QList<QByteArray>_>).m_d.d;
  if ((!bVar2) &&
     ((this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_error.
      m_data._M_exception_object == (void *)0x0)) {
    PromiseResolver<QList<QByteArray>>::
    resolve<QtPromisePrivate::PromiseValue<QList<QByteArray>>const&>
              ((PromiseResolver<QList<QByteArray>> *)resolve,&this_00->m_value);
    return;
  }
  bVar2 = PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::isPending
                    (&this_00->
                      super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>);
  if ((!bVar2) &&
     ((this_00->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_error.
      m_data._M_exception_object != (void *)0x0)) {
    PromiseResolver<QList<QByteArray>>::reject<QtPromisePrivate::PromiseError_const&>
              ((PromiseResolver<QList<QByteArray>> *)reject,
               &(((promise->super_QPromiseBase<QList<QByteArray>_>).m_d.d)->
                super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_error)
    ;
    return;
  }
  local_70.d = (resolve->m_resolver).m_d.d;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_60 = (promise->super_QPromiseBase<QList<QByteArray>_>).m_d.d;
  if (local_60 != (PromiseData<QList<QByteArray>_> *)0x0) {
    LOCK();
    pQVar1 = &(local_60->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>)
              .super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = &PTR__QPromiseBase_001557d8;
  local_58.reject.m_resolver.m_d.d = (PromiseResolver<QList<QByteArray>_>)(reject->m_resolver).m_d.d
  ;
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>)0x0
     ) {
    LOCK();
    (((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<QList<QByteArray>_>.m_d.d =
       (promise->super_QPromiseBase<QList<QByteArray>_>).m_d.d;
  if (local_58.promise.super_QPromiseBase<QList<QByteArray>_>.m_d.d !=
      (PromiseData<QList<QByteArray>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<QList<QByteArray>_>.m_d.d)->
              super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_30 = &local_58;
  local_58.promise.super_QPromiseBase<QList<QByteArray>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001557d8;
  pQStack_38 = &local_70;
  callback.fulfilled = (anon_class_24_2_e6a34898 *)pQStack_38;
  callback.this = &promise->super_QPromiseBase<QList<QByteArray>_>;
  callback.rejected = local_30;
  local_40 = promise;
  QtPromise::QPromiseBase<void>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            (&local_80,callback);
  local_80._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001551e8;
  bVar2 = PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::isPending
                    (&((promise->super_QPromiseBase<QList<QByteArray>_>).m_d.d)->
                      super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>);
  if (!bVar2) {
    PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::dispatch
              (&((promise->super_QPromiseBase<QList<QByteArray>_>).m_d.d)->
                super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>);
  }
  local_80._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00155230;
  if (local_80.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_80.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_80.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_80.m_d.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])();
    }
  }
  local_58.promise.super_QPromiseBase<QList<QByteArray>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00155820;
  if (local_58.promise.super_QPromiseBase<QList<QByteArray>_>.m_d.d !=
      (PromiseData<QList<QByteArray>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<QList<QByteArray>_>.m_d.d)->
              super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_58.promise.super_QPromiseBase<QList<QByteArray>_>.m_d.d !=
        (PromiseData<QList<QByteArray>_> *)0x0)) {
      (*((local_58.promise.super_QPromiseBase<QList<QByteArray>_>.m_d.d)->
        super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>)0x0
     ) {
    LOCK();
    (((QSharedData *)local_58.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QSharedData *)local_58.reject.m_resolver.m_d.d)->ref).
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if (((__atomic_base<int>)
         *(__int_type *)
          &(((QSharedData *)local_58.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) &&
       (local_58.reject.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>)
        0x0)) {
      operator_delete((void *)local_58.reject.m_resolver.m_d.d,0x10);
    }
  }
  local_68 = &PTR__QPromiseBase_00155820;
  if (local_60 != (PromiseData<QList<QByteArray>_> *)0x0) {
    LOCK();
    pQVar1 = &(local_60->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>)
              .super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_60 != (PromiseData<QList<QByteArray>_> *)0x0)
       ) {
      (*(local_60->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_70.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_70.d != (Data *)0x0)) {
      operator_delete(local_70.d,0x10);
    }
  }
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }